

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

vector<double> * __thiscall
mat_lib::vector<double>::operator+=
          (vector<double> *__return_storage_ptr__,vector<double> *this,vector<double> *rhs)

{
  size_t sVar1;
  pointer pdVar2;
  pointer pdVar3;
  logic_error *this_00;
  size_t sVar4;
  
  sVar1 = this->max_size__;
  if (sVar1 == rhs->max_size__) {
    pdVar2 = (rhs->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
      pdVar3[sVar4] = pdVar2[sVar4] + pdVar3[sVar4];
    }
    vector(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad sum operations");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t size() const {
          return max_size__;
      }